

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkCommsInterface.cpp
# Opt level: O2

void __thiscall
helics::NetworkCommsInterface::PortAllocator::addUsedPort
          (PortAllocator *this,string_view host,int port)

{
  iterator iVar1;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *this_00;
  int local_24;
  string_view local_20;
  
  local_24 = port;
  local_20 = host;
  iVar1 = std::
          _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
          ::find(&(this->usedPort)._M_t,&local_20);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->usedPort)._M_t._M_impl.super__Rb_tree_header) {
    local_20 = addNewHost(this,local_20);
  }
  else {
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
               &iVar1._M_node[1]._M_left,&local_24);
  }
  this_00 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
            std::
            map<std::basic_string_view<char,_std::char_traits<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
            ::operator[](&this->usedPort,&local_20);
  std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
  _M_insert_unique<int_const&>(this_00,&local_24);
  return;
}

Assistant:

void NetworkCommsInterface::PortAllocator::addUsedPort(std::string_view host, int port)
{
    auto hst = usedPort.find(host);
    if (hst != usedPort.end()) {
        hst->second.insert(port);
    } else {
        host = addNewHost(host);
    }
    usedPort[host].insert(port);
}